

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|
          (CharClass<wchar_t> *__return_storage_ptr__,CharClass<wchar_t> *this,
          CharClass<wchar_t> *cc)

{
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *this_00;
  pointer pRVar1;
  pointer pRVar2;
  CharClass<wchar_t> *pCVar3;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  _Var4;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  __last;
  wchar_t *pwVar5;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  _Var6;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  __first;
  Range<wchar_t> rj;
  Range<wchar_t> ri;
  value_type local_58;
  CharClass<wchar_t> *local_48;
  value_type local_40;
  
  local_48 = __return_storage_ptr__;
  CharClass(__return_storage_ptr__);
  _Var6._M_current =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __first._M_current =
       (cc->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_40._vptr_Range = (_func_int **)&PTR__Range_001972b8;
  local_58._vptr_Range = (_func_int **)&PTR__Range_001972b8;
  local_40.m_start = L'\0';
  local_40.m_end = L'\0';
  local_58.m_start = L'\0';
  local_58.m_end = L'\0';
  __last._M_current =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var6._M_current != __last._M_current) {
    local_40.m_start = (_Var6._M_current)->m_start;
    local_40.m_end = (_Var6._M_current)->m_end;
  }
  if (__first._M_current !=
      (cc->m_ranges).
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_58.m_start = (__first._M_current)->m_start;
    local_58.m_end = (__first._M_current)->m_end;
  }
  this_00 = &local_48->m_ranges;
  do {
    pCVar3 = local_48;
    if ((_Var6._M_current == __last._M_current) ||
       (pRVar2 = (cc->m_ranges).
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, __first._M_current == pRVar2)) {
      std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
      insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>,void>
                ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
                 this_00,(local_48->m_ranges).
                         super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,_Var6,__last);
      std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
      insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>,void>
                ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
                 this_00,(pCVar3->m_ranges).
                         super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__first,
                 (cc->m_ranges).
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      return pCVar3;
    }
    _Var4._M_current = _Var6._M_current;
    pwVar5 = &local_40.m_start;
    if (local_58.m_start < local_40.m_end) {
      if (local_40.m_start < local_58.m_end) {
        if (local_40.m_end < local_58.m_end) {
          _Var6._M_current = _Var6._M_current + 1;
          if (local_40.m_start < local_58.m_start) {
            local_58.m_start = local_40.m_start;
          }
          if (_Var6._M_current != __last._M_current) {
LAB_0011f14d:
            *(undefined8 *)pwVar5 = *(undefined8 *)&_Var4._M_current[1].m_start;
          }
        }
        else {
          pRVar1 = __first._M_current + 1;
          if (local_58.m_start < local_40.m_start) {
            local_40.m_start = local_58.m_start;
          }
          _Var4._M_current = __first._M_current;
          pwVar5 = &local_58.m_start;
          __first._M_current = pRVar1;
          if (pRVar1 != pRVar2) goto LAB_0011f14d;
        }
      }
      else {
        std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
        push_back(this_00,&local_58);
        pRVar2 = __first._M_current + 1;
        _Var4._M_current = __first._M_current;
        pwVar5 = &local_58.m_start;
        __first._M_current = pRVar2;
        if (pRVar2 != (cc->m_ranges).
                      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f14d;
      }
    }
    else {
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
                (this_00,&local_40);
      _Var6._M_current = _Var6._M_current + 1;
      if (_Var6._M_current !=
          (this->m_ranges).
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f14d;
    }
    __last._M_current =
         (this->m_ranges).
         super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

CharClass<TCHAR> CharClass<TCHAR>::operator|(const CharClass<TCHAR>& cc) const
{
    CharClass<TCHAR> new_class;

    auto i = m_ranges.cbegin();
    auto j = cc.m_ranges.cbegin();

    Range<TCHAR> ri, rj;

    if (i != m_ranges.cend()) ri = *i;
    if (j != cc.m_ranges.cend()) rj = *j;

    while (i != m_ranges.cend() && j != cc.m_ranges.cend())
    {
        if (ri < rj)
        {
            new_class.m_ranges.push_back(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        else if (ri > rj)
        {
            new_class.m_ranges.push_back(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }
        else
        {
            if (ri.end() < rj.end())
            {
                rj = rj.merge(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else
            {
                ri = ri.merge(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
        }
    }

    new_class.m_ranges.insert(new_class.m_ranges.end(), i, m_ranges.cend());
    new_class.m_ranges.insert(new_class.m_ranges.end(), j, cc.m_ranges.cend());

    return new_class;
}